

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::
     ParseMachOHeader<bloaty::macho::ParseSymbols(std::basic_string_view<char,std::char_traits<char>>,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_16_2_b2afbd3e *loadcmd_func)

{
  char *pcVar1;
  uint32_t *puVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  char *in_R8;
  char *pcVar6;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  LoadCommand local_60;
  anon_class_16_2_b2afbd3e *local_38;
  
  piVar4 = (int *)macho_file._M_str;
  uVar5 = macho_file._M_len;
  local_38 = loadcmd_func;
  if (uVar5 < 4) {
    Throw("Malformed Mach-O file",0x2c);
  }
  iVar3 = *piVar4;
  if (iVar3 < -0x1120531) {
    if (iVar3 != -0x1120532) {
      if ((iVar3 == -0x31051202) || (iVar3 == -0x30051202)) {
        Throw("We don\'t support cross-endian Mach-O files.",0x97);
      }
LAB_0019ed5d:
      Throw("Corrupt Mach-O file",0x99);
    }
    if (uVar5 < 0x1c) {
LAB_0019ece2:
      Throw("Premature EOF reading Mach-O data.",0x36);
    }
    data._M_str = in_R8;
    data._M_len = (size_t)piVar4;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x1c,data);
    iVar3 = piVar4[4];
    if (iVar3 != 0) {
      puVar2 = (uint32_t *)(piVar4 + 7);
      pcVar6 = (char *)(uVar5 - 0x1c);
      do {
        if (pcVar6 < (char *)0x8) goto LAB_0019ece2;
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar1 == (char *)0x0) {
LAB_0019ecf3:
          Throw("Mach-O load command had zero size.",0x66);
        }
        local_60.is64bit = false;
        local_60.cmd = *puVar2;
        if (pcVar6 < pcVar1) {
LAB_0019ed04:
          local_60.file_data._M_str = (char *)0x0;
          local_60.file_data._M_len = 0;
          local_60.command_data._M_str = (char *)0x0;
          local_60.command_data._M_len = 0;
          Throw("region out-of-bounds",0x5d);
        }
        local_60.command_data._M_len = (size_t)pcVar1;
        local_60.command_data._M_str = (char *)puVar2;
        local_60.file_data._M_len = uVar5;
        local_60.file_data._M_str = (char *)piVar4;
        if (local_60.cmd == 2) {
          ParseSymbolsFromSymbolTable<nlist>(&local_60,local_38->symtab,local_38->sink);
        }
        data_00._M_str = in_R8;
        data_00._M_len = (size_t)local_60.command_data._M_str;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",
                         (char *)local_60.command_data._M_len,data_00);
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar6 < pcVar1) {
LAB_0019ed15:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar1,pcVar6);
        }
        puVar2 = (uint32_t *)((long)puVar2 + (long)pcVar1);
        iVar3 = iVar3 + -1;
        pcVar6 = pcVar6 + -(long)pcVar1;
      } while (iVar3 != 0);
    }
  }
  else {
    if (iVar3 != -0x1120531) goto LAB_0019ed5d;
    if (uVar5 < 0x20) goto LAB_0019ece2;
    data_01._M_str = in_R8;
    data_01._M_len = (size_t)piVar4;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x20,data_01);
    iVar3 = piVar4[4];
    if (iVar3 != 0) {
      puVar2 = (uint32_t *)(piVar4 + 8);
      pcVar6 = (char *)(uVar5 - 0x20);
      do {
        if (pcVar6 < (char *)0x8) goto LAB_0019ece2;
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar1 == (char *)0x0) goto LAB_0019ecf3;
        local_60.is64bit = true;
        local_60.cmd = *puVar2;
        if (pcVar6 < pcVar1) goto LAB_0019ed04;
        local_60.command_data._M_len = (size_t)pcVar1;
        local_60.command_data._M_str = (char *)puVar2;
        local_60.file_data._M_len = uVar5;
        local_60.file_data._M_str = (char *)piVar4;
        if (local_60.cmd == 2) {
          ParseSymbolsFromSymbolTable<nlist_64>(&local_60,local_38->symtab,local_38->sink);
        }
        data_02._M_str = in_R8;
        data_02._M_len = (size_t)local_60.command_data._M_str;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",
                         (char *)local_60.command_data._M_len,data_02);
        pcVar1 = (char *)(ulong)puVar2[1];
        if (pcVar6 < pcVar1) goto LAB_0019ed15;
        puVar2 = (uint32_t *)((long)puVar2 + (long)pcVar1);
        iVar3 = iVar3 + -1;
        pcVar6 = pcVar6 + -(long)pcVar1;
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}